

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

int __thiscall
btGeneric6DofSpring2Constraint::setLinearLimits
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  btScalar *pbVar5;
  btScalar *pbVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  float fVar14;
  btRotationalLimitMotor2 local_b0;
  btTransform *local_58;
  btTransform *local_50;
  btVector3 *local_48;
  btVector3 axis;
  
  iVar1 = 1;
  uVar3 = 0;
  local_58 = transA;
  local_50 = transB;
  local_48 = linVelA;
  do {
    iVar4 = (int)uVar3 * 4;
    lVar7 = uVar3 * -4 + -0x310;
    lVar9 = uVar3 * -4 + -800;
    lVar10 = uVar3 * -4 + -0x2f0;
    lVar11 = uVar3 * -4 + -0x300;
    while( true ) {
      if (uVar3 == 3) {
        return row;
      }
      local_b0.m_currentLimit = (this->m_linearLimits).m_currentLimit[uVar3];
      local_b0.m_enableMotor = (this->m_linearLimits).m_enableMotor[uVar3];
      if (((local_b0.m_currentLimit != 0) || ((local_b0.m_enableMotor & 1U) != 0)) ||
         ((this->m_linearLimits).m_enableSpring[uVar3] != false)) break;
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 4;
      lVar7 = lVar7 + -4;
      lVar9 = lVar9 + -4;
      lVar10 = lVar10 + -4;
      lVar11 = lVar11 + -4;
    }
    local_b0.m_bounce = (this->m_linearLimits).m_bounce.m_floats[uVar3];
    local_b0.m_currentPosition = (this->m_linearLimits).m_currentLinearDiff.m_floats[uVar3];
    local_b0.m_currentLimitError = (this->m_linearLimits).m_currentLimitError.m_floats[uVar3];
    local_b0.m_currentLimitErrorHi = (this->m_linearLimits).m_currentLimitErrorHi.m_floats[uVar3];
    local_b0.m_servoMotor = (this->m_linearLimits).m_servoMotor[uVar3];
    local_b0.m_servoTarget = (this->m_linearLimits).m_servoTarget.m_floats[uVar3];
    local_b0.m_enableSpring = (this->m_linearLimits).m_enableSpring[uVar3];
    local_b0.m_springStiffness = (this->m_linearLimits).m_springStiffness.m_floats[uVar3];
    local_b0.m_springStiffnessLimited = (this->m_linearLimits).m_springStiffnessLimited[uVar3];
    local_b0.m_springDamping = (this->m_linearLimits).m_springDamping.m_floats[uVar3];
    local_b0.m_springDampingLimited = (this->m_linearLimits).m_springDampingLimited[uVar3];
    local_b0.m_equilibriumPoint = (this->m_linearLimits).m_equilibriumPoint.m_floats[uVar3];
    local_b0.m_hiLimit = (this->m_linearLimits).m_upperLimit.m_floats[uVar3];
    local_b0.m_loLimit = (this->m_linearLimits).m_lowerLimit.m_floats[uVar3];
    local_b0.m_maxMotorForce = (this->m_linearLimits).m_maxMotorForce.m_floats[uVar3];
    local_b0.m_targetVelocity = (this->m_linearLimits).m_targetVelocity.m_floats[uVar3];
    axis.m_floats[1] = (&(this->m_calculatedTransformA).m_origin)[-2].m_floats[uVar3];
    axis.m_floats[0] = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[uVar3];
    axis.m_floats[2] = (&(this->m_calculatedTransformA).m_origin)[-1].m_floats[uVar3];
    axis.m_floats[3] = 0.0;
    uVar12 = this->m_flags >> ((byte)iVar4 & 0x1f);
    if ((uVar12 & 1) == 0) {
      pbVar5 = info->cfm;
    }
    else {
      pbVar5 = (btScalar *)((long)this - lVar11);
    }
    pbVar6 = (btScalar *)((long)this - lVar10);
    if ((uVar12 & 2) == 0) {
      pbVar6 = &info->erp;
    }
    local_b0.m_stopCFM = *pbVar5;
    local_b0.m_stopERP = *pbVar6;
    if ((uVar12 & 4) == 0) {
      pbVar5 = info->cfm;
    }
    else {
      pbVar5 = (btScalar *)((long)this - lVar9);
    }
    pbVar6 = (btScalar *)((long)this - lVar7);
    if ((uVar12 & 8) == 0) {
      pbVar6 = &info->erp;
    }
    local_b0.m_motorCFM = *pbVar5;
    local_b0.m_motorERP = *pbVar6;
    uVar8 = 0;
    if (uVar3 != 2) {
      uVar8 = uVar3 + 1 & 0xffffffff;
    }
    iVar4 = this->m_angularLimits[uVar8].m_currentLimit;
    bVar2 = true;
    if (1 < iVar4 - 1U) {
      if (iVar4 == 4) {
        if (-0.001 <= this->m_angularLimits[uVar8].m_currentLimitError) {
          fVar14 = this->m_angularLimits[uVar8].m_currentLimitErrorHi;
          goto LAB_001729ac;
        }
      }
      else if (iVar4 == 3) {
        fVar14 = ABS(this->m_angularLimits[uVar8].m_currentLimitError);
LAB_001729ac:
        bVar2 = 0.001 < fVar14;
      }
      else {
        bVar2 = false;
      }
    }
    uVar8 = (ulong)((int)uVar3 - 1);
    if (uVar3 == 0) {
      uVar8 = 2;
    }
    iVar4 = this->m_angularLimits[uVar8].m_currentLimit;
    iVar13 = iVar1;
    if (iVar4 - 1U < 2) {
LAB_00172a20:
      iVar13 = 0;
    }
    else {
      if (iVar4 == 4) {
        if (-0.001 <= this->m_angularLimits[uVar8].m_currentLimitError) {
          fVar14 = this->m_angularLimits[uVar8].m_currentLimitErrorHi;
          goto LAB_00172a13;
        }
        goto LAB_00172a20;
      }
      if (iVar4 == 3) {
        fVar14 = ABS(this->m_angularLimits[uVar8].m_currentLimitError);
LAB_00172a13:
        if (0.001 < fVar14) goto LAB_00172a20;
      }
    }
    if (!bVar2) {
      iVar13 = iVar1;
    }
    iVar4 = get_limit_motor_info2
                      (this,&local_b0,local_58,local_50,local_48,linVelB,angVelA,angVelB,info,row,
                       &axis,0,iVar13);
    row = iVar4 + row;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int btGeneric6DofSpring2Constraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	//solve linear limits
	btRotationalLimitMotor2 limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.m_currentLimit[i] || m_linearLimits.m_enableMotor[i] || m_linearLimits.m_enableSpring[i])
		{ // re-use rotational motor code
			limot.m_bounce                 = m_linearLimits.m_bounce[i];
			limot.m_currentLimit           = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition        = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError      = m_linearLimits.m_currentLimitError[i];
			limot.m_currentLimitErrorHi    = m_linearLimits.m_currentLimitErrorHi[i];
			limot.m_enableMotor            = m_linearLimits.m_enableMotor[i];
			limot.m_servoMotor             = m_linearLimits.m_servoMotor[i];
			limot.m_servoTarget            = m_linearLimits.m_servoTarget[i];
			limot.m_enableSpring           = m_linearLimits.m_enableSpring[i];
			limot.m_springStiffness        = m_linearLimits.m_springStiffness[i];
			limot.m_springStiffnessLimited = m_linearLimits.m_springStiffnessLimited[i];
			limot.m_springDamping          = m_linearLimits.m_springDamping[i];
			limot.m_springDampingLimited   = m_linearLimits.m_springDampingLimited[i];
			limot.m_equilibriumPoint       = m_linearLimits.m_equilibriumPoint[i];
			limot.m_hiLimit                = m_linearLimits.m_upperLimit[i];
			limot.m_loLimit                = m_linearLimits.m_lowerLimit[i];
			limot.m_maxMotorForce          = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity         = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT2);
			limot.m_stopCFM  = (flags & BT_6DOF_FLAGS_CFM_STOP2) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP  = (flags & BT_6DOF_FLAGS_ERP_STOP2) ? m_linearLimits.m_stopERP[i] : info->erp;
			limot.m_motorCFM = (flags & BT_6DOF_FLAGS_CFM_MOTO2) ? m_linearLimits.m_motorCFM[i] : info->cfm[0];
			limot.m_motorERP = (flags & BT_6DOF_FLAGS_ERP_MOTO2) ? m_linearLimits.m_motorERP[i] : info->erp;

			//rotAllowed is a bit of a magic from the original 6dof. The calculation of it here is something that imitates the original behavior as much as possible.
			int indx1 = (i + 1) % 3;
			int indx2 = (i + 2) % 3;
			int rotAllowed = 1; // rotations around orthos to current axis (it is used only when one of the body is static)
			#define D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION 1.0e-3
			bool indx1Violated = m_angularLimits[indx1].m_currentLimit == 1 ||
				m_angularLimits[indx1].m_currentLimit == 2 ||
				( m_angularLimits[indx1].m_currentLimit == 3 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx1].m_currentLimit == 4 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			bool indx2Violated = m_angularLimits[indx2].m_currentLimit == 1 ||
				m_angularLimits[indx2].m_currentLimit == 2 ||
				( m_angularLimits[indx2].m_currentLimit == 3 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx2].m_currentLimit == 4 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			if( indx1Violated && indx2Violated )
			{
				rotAllowed = 0;
			}
			row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);

		}
	}
	return row;
}